

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall sglr::GLContext::deleteBuffers(GLContext *this,int numBuffers,deUint32 *buffers)

{
  ulong uVar1;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar2;
  
  uVar1 = (ulong)(uint)numBuffers;
  glu::CallLogWrapper::glDeleteBuffers(this->m_wrapper,numBuffers,buffers);
  if (0 < numBuffers) {
    do {
      pVar2 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(&(this->m_allocatedBuffers)._M_t,buffers);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&(this->m_allocatedBuffers)._M_t,(_Base_ptr)pVar2.first._M_node,
                     (_Base_ptr)pVar2.second._M_node);
      buffers = buffers + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void GLContext::deleteBuffers (int numBuffers, const deUint32* buffers)
{
	m_wrapper->glDeleteBuffers(numBuffers, buffers);
	for (int i = 0; i < numBuffers; i++)
		m_allocatedBuffers.erase(buffers[i]);
}